

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugger.cpp
# Opt level: O0

void cs_debugger_step_callback(statement_base *stmt)

{
  breakpoint_recorder *pbVar1;
  bool bVar2;
  size_t sVar3;
  MappedReference<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char>,_cs::csym_info>_>
  pcVar4;
  size_t sVar5;
  size_type sVar6;
  reference pvVar7;
  breakpoint_recorder *pbVar8;
  reference pvVar9;
  void *pvVar10;
  ostream *poVar11;
  statement_base *this;
  string *psVar12;
  statement_base *in_RDI;
  string *code;
  size_t actual_line;
  size_t current_line;
  csym_info *csym;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  key_arg<std::__cxx11::basic_string<char>_> *in_stack_ffffffffffffffb8;
  raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
  *in_stack_ffffffffffffffc0;
  breakpoint_recorder *in_stack_ffffffffffffffc8;
  breakpoint_recorder *this_00;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::csym_info>_>_>
  *in_stack_ffffffffffffffd0;
  
  cs::statement_base::get_file_path_abi_cxx11_((statement_base *)0x125213);
  bVar2 = std::operator!=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (!bVar2) {
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x125239);
    std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x125241);
    sVar3 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
            ::count<std::__cxx11::string>
                      (in_stack_ffffffffffffffd0,
                       (key_arg<std::__cxx11::basic_string<char>_> *)in_stack_ffffffffffffffc8);
    if (sVar3 == 0) {
      if ((exec_by_step & 1U) == 0) {
        cs::statement_base::get_line_num(in_RDI);
        bVar2 = breakpoint_recorder::exist
                          (in_stack_ffffffffffffffc8,(size_t)in_stack_ffffffffffffffc0);
        if (bVar2) {
          poVar11 = std::operator<<((ostream *)&std::cout,"\nHit breakpoint, at \"");
          psVar12 = cs::statement_base::get_file_path_abi_cxx11_((statement_base *)0x1254de);
          poVar11 = std::operator<<(poVar11,(string *)psVar12);
          poVar11 = std::operator<<(poVar11,"\", line ");
          sVar3 = cs::statement_base::get_line_num(in_RDI);
          pvVar10 = (void *)std::ostream::operator<<(poVar11,sVar3);
          std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
          current_level =
               cs::stack_type<cs_impl::any,_std::allocator>::size
                         ((stack_type<cs_impl::any,_std::allocator> *)(cs::current_process + 0x80));
          exec_by_step = true;
        }
      }
      if (((exec_by_step & 1U) != 0) &&
         (((step_into_function & 1U) != 0 ||
          (sVar3 = cs::stack_type<cs_impl::any,_std::allocator>::size
                             ((stack_type<cs_impl::any,_std::allocator> *)
                              (cs::current_process + 0x80)), sVar3 <= current_level)))) {
        sVar3 = cs::statement_base::get_line_num(in_RDI);
        poVar11 = (ostream *)std::ostream::operator<<(&std::cout,sVar3);
        this = (statement_base *)std::operator<<(poVar11,"\t");
        psVar12 = cs::statement_base::get_raw_code_abi_cxx11_(this);
        poVar11 = std::operator<<((ostream *)this,(string *)psVar12);
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        current_level =
             cs::stack_type<cs_impl::any,_std::allocator>::size
                       ((stack_type<cs_impl::any,_std::allocator> *)(cs::current_process + 0x80));
        step_into_function = false;
        do {
          bVar2 = covscript_debugger();
        } while (bVar2);
      }
    }
    else {
      std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x12526a);
      std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x125272);
      pcVar4 = phmap::priv::
               raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cs::csym_info>>>
               ::
               operator[]<std::__cxx11::string,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,cs::csym_info>>
                         (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      sVar5 = cs::statement_base::get_line_num(in_RDI);
      sVar3 = sVar5;
      sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&pcVar4->map);
      if (sVar3 < sVar6) {
        pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&pcVar4->map,sVar5 - 1);
        pbVar1 = (breakpoint_recorder *)*pvVar7;
        this_00 = pbVar1;
        pbVar8 = (breakpoint_recorder *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(&pcVar4->codes);
        if ((this_00 < pbVar8) && (pbVar1 != (breakpoint_recorder *)0x0)) {
          pvVar9 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&pcVar4->codes,
                                (size_type)
                                ((long)&pbVar1[-1].m_pending.
                                        super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
                                        .
                                        super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>
                                        .settings_.
                                        super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                                        .
                                        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_bool>_>_>_>,_0UL,_false>
                                        .value + 7));
          if (((exec_by_step & 1U) == 0) &&
             (bVar2 = breakpoint_recorder::exist(this_00,(size_t)in_stack_ffffffffffffffc0), bVar2))
          {
            poVar11 = std::operator<<((ostream *)&std::cout,"\nHit breakpoint, at \"");
            poVar11 = std::operator<<(poVar11,(string *)pcVar4);
            poVar11 = std::operator<<(poVar11,"\", line ");
            pvVar10 = (void *)std::ostream::operator<<(poVar11,(ulong)pbVar1);
            std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
            current_level =
                 cs::stack_type<cs_impl::any,_std::allocator>::size
                           ((stack_type<cs_impl::any,_std::allocator> *)(cs::current_process + 0x80)
                           );
            exec_by_step = true;
          }
          if (((exec_by_step & 1U) != 0) &&
             (((step_into_function & 1U) != 0 ||
              (sVar3 = cs::stack_type<cs_impl::any,_std::allocator>::size
                                 ((stack_type<cs_impl::any,_std::allocator> *)
                                  (cs::current_process + 0x80)), sVar3 <= current_level)))) {
            poVar11 = (ostream *)std::ostream::operator<<(&std::cout,(ulong)pbVar1);
            poVar11 = std::operator<<(poVar11,"\t");
            poVar11 = std::operator<<(poVar11,(string *)pvVar9);
            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
            current_level =
                 cs::stack_type<cs_impl::any,_std::allocator>::size
                           ((stack_type<cs_impl::any,_std::allocator> *)(cs::current_process + 0x80)
                           );
            step_into_function = false;
            do {
              bVar2 = covscript_debugger();
            } while (bVar2);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void cs_debugger_step_callback(cs::statement_base *stmt)
{
	if (stmt->get_file_path() != path)
		return;
	if (context->compiler->csyms.count(path) > 0) {
		cs::csym_info &csym = context->compiler->csyms[path];
		std::size_t current_line = stmt->get_line_num();
		if (current_line >= csym.map.size())
			return;
		std::size_t actual_line = csym.map[current_line - 1];
		if (actual_line >= csym.codes.size() || actual_line == 0)
			return;
		const std::string &code = csym.codes[actual_line - 1];
		if (!exec_by_step && breakpoints.exist(actual_line)) {
			std::cout << "\nHit breakpoint, at \"" << csym.file << "\", line " << actual_line
			          << std::endl;
			current_level = cs::current_process->stack.size();
			exec_by_step = true;
		}
		if (exec_by_step && (step_into_function || cs::current_process->stack.size() <= current_level)) {
			std::cout << actual_line << "\t" << code << std::endl;
			current_level = cs::current_process->stack.size();
			step_into_function = false;
			while (covscript_debugger());
		}
	}
	else {
		if (!exec_by_step && breakpoints.exist(stmt->get_line_num())) {
			std::cout << "\nHit breakpoint, at \"" << stmt->get_file_path() << "\", line " << stmt->get_line_num()
			          << std::endl;
			current_level = cs::current_process->stack.size();
			exec_by_step = true;
		}
		if (exec_by_step && (step_into_function || cs::current_process->stack.size() <= current_level)) {
			std::cout << stmt->get_line_num() << "\t" << stmt->get_raw_code() << std::endl;
			current_level = cs::current_process->stack.size();
			step_into_function = false;
			while (covscript_debugger());
		}
	}
}